

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

int __thiscall QThread::exec(QThread *this)

{
  qsizetype *this_00;
  long lVar1;
  void *pvVar2;
  QObjectData *pQVar3;
  int iVar4;
  QBindingStatus *status;
  long in_FS_OFFSET;
  QEventLoop local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QObject).d_ptr.d;
  status = QtPrivate::getBindingStatus();
  this_00 = &pQVar3[1].children.d.size;
  if (pQVar3[1].children.d.size == 0) {
    LOCK();
    lVar1 = *this_00;
    if (lVar1 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar1 != 0) goto LAB_003471dd;
  }
  else {
LAB_003471dd:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  QtPrivate::BindingStatusOrList::setStatusAndClearList
            ((BindingStatusOrList *)&pQVar3[2].parent,status);
  *(undefined1 *)((long)&pQVar3[2].q_ptr[8].d_ptr.d + 4) = 0;
  if (*(char *)((long)&pQVar3[1].postedEvents.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1) ==
      '\x01') {
    *(undefined1 *)
     ((long)&pQVar3[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + 1) = 0;
    iVar4 = *(int *)((long)&pQVar3[1].metaObject + 4);
    goto LAB_0034728d;
  }
  LOCK();
  pvVar2 = (void *)*this_00;
  *this_00 = 0;
  UNLOCK();
  if (pvVar2 != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,pvVar2);
  }
  local_38.super_QObject._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.super_QObject.d_ptr.d = (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QEventLoop::QEventLoop(&local_38,(QObject *)0x0);
  iVar4 = QEventLoop::exec(&local_38,(ProcessEventsFlags)0x0);
  if (*this_00 == 0) {
    LOCK();
    lVar1 = *this_00;
    if (lVar1 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar1 != 0) goto LAB_0034726a;
  }
  else {
LAB_0034726a:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  *(undefined1 *)
   ((long)&pQVar3[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1) = 0;
  *(undefined4 *)((long)&pQVar3[1].metaObject + 4) = 0xffffffff;
  QEventLoop::~QEventLoop(&local_38);
LAB_0034728d:
  LOCK();
  pvVar2 = (void *)*this_00;
  *this_00 = 0;
  UNLOCK();
  if (pvVar2 != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,pvVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QThread::exec()
{
    Q_D(QThread);
    const auto status = QtPrivate::getBindingStatus(QtPrivate::QBindingStatusAccessToken{});

    QMutexLocker locker(&d->mutex);
    d->m_statusOrPendingObjects.setStatusAndClearList(status);
    d->data->quitNow = false;
    if (d->exited) {
        d->exited = false;
        return d->returnCode;
    }
    locker.unlock();

    QEventLoop eventLoop;
    int returnCode = eventLoop.exec();

    locker.relock();
    d->exited = false;
    d->returnCode = -1;
    return returnCode;
}